

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observers.h
# Opt level: O1

void __thiscall
obs::observers<Observer>::notify_observers<int>
          (observers<Observer> *this,offset_in_observer_type_to_subr method,int args)

{
  bool bVar1;
  code *pcVar2;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  long *plVar3;
  iterator __begin0;
  iterator __end0;
  iterator iStack_78;
  iterator local_50;
  
  safe_list<Observer>::begin(&iStack_78,&this->m_observers);
  safe_list<Observer>::end(&local_50,&this->m_observers);
  while( true ) {
    bVar1 = safe_list<Observer>::iterator::operator!=(&iStack_78,&local_50);
    if (!bVar1) {
      safe_list<Observer>::iterator::~iterator(&local_50);
      safe_list<Observer>::iterator::~iterator(&iStack_78);
      return;
    }
    if ((iStack_78.m_node == (node *)0x0) || (iStack_78.m_locked == false)) break;
    if (iStack_78.m_value != (Observer *)0x0) {
      plVar3 = (long *)((long)&(iStack_78.m_value)->_vptr_Observer +
                       CONCAT44(in_register_00000014,args));
      pcVar2 = (code *)method;
      if ((method & 1) != 0) {
        pcVar2 = *(code **)(*plVar3 + -1 + method);
      }
      (*pcVar2)(plVar3,in_ECX);
    }
    safe_list<Observer>::iterator::operator++(&iStack_78);
  }
  __assert_fail("m_node && m_locked",
                "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                ,0xd8,"T *obs::safe_list<Observer>::iterator::operator*() const [T = Observer]");
}

Assistant:

void notify_observers(void (observer_type::*method)(Args...), Args ...args) {
    for (auto observer : m_observers) {
      if (observer)
        (observer->*method)(std::forward<Args>(args)...);
    }
  }